

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptString.cpp
# Opt level: O1

bool Js::JavascriptString::BuildFirstCharBackwardBoyerMooreTable
               (Boyer_Moore_Jump *jmpTable,char16 *searchStr,int searchLen)

{
  char16 cVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  ulong uVar5;
  char16 *pcVar6;
  char16 *pcVar7;
  
  if (searchLen < 1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                ,0xdf5,"(searchLen >= 1)","Table for non-empty string");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  memset(jmpTable,0,0x200);
  pcVar7 = searchStr;
  do {
    pcVar6 = pcVar7;
    if (searchStr + searchLen <= pcVar6) break;
    cVar1 = *pcVar6;
    uVar5 = (ulong)(ushort)cVar1;
    pcVar7 = pcVar6;
    if (uVar5 < 0x80) {
      if (jmpTable[uVar5].shift == 0) {
        jmpTable[uVar5].shift = (uint32)((ulong)((long)pcVar6 - (long)searchStr) >> 1);
      }
      pcVar7 = pcVar6 + 1;
    }
  } while ((ushort)cVar1 < 0x80);
  return searchStr + searchLen <= pcVar6;
}

Assistant:

bool JavascriptString::BuildFirstCharBackwardBoyerMooreTable(JmpTable jmpTable, const char16* searchStr, int searchLen)
    {
        AssertMsg(searchLen >= 1, "Table for non-empty string");
        memset(jmpTable, 0, sizeof(JmpTable));

        const char16 * p2 = searchStr;
        const char16 * const end = searchStr + searchLen;

        // Determine if we can do a partial ASCII Boyer-Moore
        while (p2 < end)
        {
            WCHAR c = *p2;
            if ( 0 == ( c & ~0x7f ))
            {
                if ( jmpTable[c].shift == 0 )
                {
                    jmpTable[c].shift = (uint32)(p2 - searchStr);
                }
            }
            else
            {
                return false;
            }
            p2++;
        }

        return true;
    }